

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O2

string * __thiscall
rcg::getComponetOfPart_abi_cxx11_
          (string *__return_storage_ptr__,rcg *this,shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,
          Buffer *buffer,uint32_t ipart)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long *plVar4;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  undefined8 uVar8;
  undefined8 *puVar9;
  uint64_t uVar10;
  uint32_t part;
  ulong uVar11;
  NodeList_t list;
  gcstring local_80 [80];
  
  part = (uint32_t)buffer;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  plVar4 = *(long **)this;
  GenICam_3_4::gcstring::gcstring(local_80,"ChunkComponentSelector");
  lVar3 = (**(code **)(*plVar4 + 0x38))(plVar4,local_80);
  if (lVar3 == 0) {
    plVar4 = (long *)0x0;
  }
  else {
    plVar4 = (long *)__dynamic_cast(lVar3,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IEnumeration::typeinfo,0xfffffffffffffffe);
  }
  GenICam_3_4::gcstring::~gcstring(local_80);
  plVar5 = *(long **)this;
  GenICam_3_4::gcstring::gcstring(local_80,"ChunkPartIndex");
  lVar3 = (**(code **)(*plVar5 + 0x38))(plVar5,local_80);
  if (lVar3 == 0) {
    plVar5 = (long *)0x0;
  }
  else {
    plVar5 = (long *)__dynamic_cast(lVar3,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
  }
  GenICam_3_4::gcstring::~gcstring(local_80);
  if (((((plVar4 != (long *)0x0) && (plVar5 != (long *)0x0)) &&
       (iVar2 = (*(code *)**(undefined8 **)((long)plVar4 + *(long *)(*plVar4 + -0x28)))
                          ((long)plVar4 + *(long *)(*plVar4 + -0x28)), iVar2 - 3U < 2)) &&
      ((iVar2 = (*(code *)**(undefined8 **)((long)plVar4 + *(long *)(*plVar4 + -0x28)))
                          ((long)plVar4 + *(long *)(*plVar4 + -0x28)), iVar2 == 4 || (iVar2 == 2))))
     && (iVar2 = (*(code *)**(undefined8 **)((long)plVar5 + *(long *)(*plVar5 + -0x28)))
                           ((long)plVar5 + *(long *)(*plVar5 + -0x28)), iVar2 - 3U < 2)) {
    GenApi_3_4::node_vector::node_vector(&list);
    (**(code **)(*plVar4 + 0x40))(plVar4,&list);
    uVar11 = 0;
    while ((uVar6 = GenApi_3_4::node_vector::size(), uVar11 < uVar6 &&
           (__return_storage_ptr__->_M_string_length == 0))) {
      plVar7 = (long *)GenApi_3_4::node_vector::operator[]((ulong)&list);
      if ((*plVar7 != 0) &&
         ((plVar7 = (long *)__dynamic_cast(*plVar7,&GenApi_3_4::INode::typeinfo,
                                           &GenApi_3_4::IEnumEntry::typeinfo,0xfffffffffffffffe),
          plVar7 != (long *)0x0 &&
          (iVar2 = (*(code *)**(undefined8 **)((long)plVar7 + *(long *)(*plVar7 + -0x28)))
                             ((long)plVar7 + *(long *)(*plVar7 + -0x28)), iVar2 - 3U < 2)))) {
        uVar8 = (**(code **)(*plVar7 + 0x38))(plVar7);
        (**(code **)(*plVar4 + 0x50))(plVar4,uVar8,1);
        uVar6 = (**(code **)(*plVar5 + 0x48))(plVar5,0,0);
        if (uVar6 == ((ulong)buffer & 0xffffffff)) {
          puVar9 = (undefined8 *)GenApi_3_4::node_vector::operator[]((ulong)&list);
          plVar7 = (long *)__dynamic_cast(*puVar9,&GenApi_3_4::INode::typeinfo,
                                          &GenApi_3_4::IEnumEntry::typeinfo,0xfffffffffffffffe);
          (**(code **)(*plVar7 + 0x40))(local_80,plVar7);
          GenICam_3_4::gcstring::operator_cast_to_char_(local_80);
          std::__cxx11::string::assign((char *)__return_storage_ptr__);
          GenICam_3_4::gcstring::~gcstring(local_80);
        }
      }
      uVar11 = uVar11 + 1;
    }
    GenApi_3_4::node_vector::~node_vector(&list);
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    return __return_storage_ptr__;
  }
  bVar1 = Buffer::getImagePresent((Buffer *)nodemap,part);
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  uVar10 = Buffer::getPixelFormat((Buffer *)nodemap,part);
  if (uVar10 != 0x1080001) {
    if ((uVar10 == 0x10800c6) || (uVar10 == 0x11000b8)) goto LAB_0011b4ad;
    if (uVar10 != 0x20c005a) {
      if (uVar10 != 0x81080001) {
        return __return_storage_ptr__;
      }
      goto LAB_0011b4ad;
    }
  }
  Buffer::getWidth((Buffer *)nodemap,part);
  Buffer::getHeight((Buffer *)nodemap,part);
LAB_0011b4ad:
  std::__cxx11::string::assign((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string getComponetOfPart(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap,
                              const Buffer *buffer, uint32_t ipart)
{
  std::string component;

  try
  {
    // get chunk component selector and proprietary chunk part index parmeters

    GenApi::IEnumeration *sel=dynamic_cast<GenApi::IEnumeration *>(nodemap->_GetNode("ChunkComponentSelector"));
    GenApi::IInteger *part=dynamic_cast<GenApi::IInteger *>(nodemap->_GetNode("ChunkPartIndex"));

    if (sel != 0 && part != 0)
    {
      if (GenApi::IsReadable(sel) && GenApi::IsWritable(sel) && GenApi::IsReadable(part))
      {
        // go through all available enumerations

        GenApi::NodeList_t list;
        sel->GetEntries(list);

        for (size_t i=0; i<list.size() && component.size() == 0; i++)
        {
          GenApi::IEnumEntry *entry=dynamic_cast<GenApi::IEnumEntry *>(list[i]);

          if (entry != 0 && GenApi::IsReadable(entry))
          {
            sel->SetIntValue(entry->GetValue());

            int64_t val=part->GetValue();
            if (val == ipart)
            {
              component=dynamic_cast<GenApi::IEnumEntry *>(list[i])->GetSymbolic();
            }
          }
        }
      }
    }
  }
  catch (const std::exception &)
  { /* ignore errors */ }
  catch (const GENICAM_NAMESPACE::GenericException &)
  { /* ignore errors */ }

  // try guessing component name from pixel format

  if (component.size() == 0 && buffer->getImagePresent(ipart))
  {
    switch (buffer->getPixelFormat(ipart))
    {
      case Mono8:
      case YCbCr411_8:
        if (buffer->getWidth(ipart) >= buffer->getHeight(ipart))
        {
          component="Intensity";
        }
        else
        {
          component="IntensityCombined";
        }
        break;

      case Coord3D_C16:
        component="Disparity";
        break;

      case Confidence8:
        component="Confidence";
        break;

      case Error8:
        component="Error";
        break;

      default:
        break;
    }
  }

  return component;
}